

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor * ggml_reshape_3d(ggml_context *ctx,ggml_tensor *a,int64_t ne0,int64_t ne1,int64_t ne2)

{
  _Bool _Var1;
  ggml_tensor *tensor;
  char *pcVar2;
  int line;
  int64_t ne [3];
  int64_t local_48;
  int64_t local_40;
  int64_t local_38;
  
  _Var1 = ggml_is_contiguous_n(a,0);
  if (_Var1) {
    if (a->ne[1] * a->ne[0] * a->ne[2] * a->ne[3] - ne1 * ne0 * ne2 == 0) {
      local_48 = ne0;
      local_40 = ne1;
      local_38 = ne2;
      tensor = ggml_new_tensor_impl(ctx,a->type,3,&local_48,a,0);
      ggml_format_name(tensor,"%s (reshaped)",a->name);
      tensor->op = GGML_OP_RESHAPE;
      tensor->src[0] = a;
      return tensor;
    }
    pcVar2 = "ggml_nelements(a) == ne0*ne1*ne2";
    line = 0xc2e;
  }
  else {
    pcVar2 = "ggml_is_contiguous(a)";
    line = 0xc2d;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c",
             line,"GGML_ASSERT(%s) failed",pcVar2);
}

Assistant:

struct ggml_tensor * ggml_reshape_3d(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int64_t               ne0,
        int64_t               ne1,
        int64_t               ne2) {
    GGML_ASSERT(ggml_is_contiguous(a));
    GGML_ASSERT(ggml_nelements(a) == ne0*ne1*ne2);

    const int64_t ne[3] = { ne0, ne1, ne2 };
    struct ggml_tensor * result = ggml_new_tensor_impl(ctx, a->type, 3, ne, a, 0);
    ggml_format_name(result, "%s (reshaped)", a->name);

    result->op     = GGML_OP_RESHAPE;
    result->src[0] = a;

    return result;
}